

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib.cpp
# Opt level: O0

tuple<double,_int> operator()(vector<rc,_std::allocator<rc>_> *r,int r_size,int result)

{
  int *piVar1;
  const_reference pvVar2;
  undefined4 in_register_00000034;
  tuple<double,_int> tVar3;
  int local_38;
  int local_34;
  int local_30;
  int e;
  int i;
  int sumf;
  double sumr;
  int result_local;
  int r_size_local;
  vector<rc,_std::allocator<rc>_> *r_local;
  
  _result_local =
       (vector<main::__6::TEMPNAMEPLACEHOLDERVALUE()const::rc,std::allocator<main::__6::TEMPNAMEPLACEHOLDERVALUE()const::rc>>
        *)CONCAT44(in_register_00000034,r_size);
  _i = 0.0;
  e = 0;
  local_30 = 0;
  local_38 = result + -1;
  sumr._4_4_ = result;
  r_local = r;
  piVar1 = std::min<int>(&local_38,(int *)&sumr);
  local_34 = *piVar1;
  for (; local_30 <= local_34; local_30 = local_30 + 1) {
    pvVar2 = std::
             vector<main::$_6::TEMPNAMEPLACEHOLDERVALUE()const::rc,std::allocator<main::$_6::TEMPNAMEPLACEHOLDERVALUE()const::rc>>
             ::operator()(_result_local,(long)local_30);
    _i = pvVar2->value + _i;
    pvVar2 = std::
             vector<main::$_6::TEMPNAMEPLACEHOLDERVALUE()const::rc,std::allocator<main::$_6::TEMPNAMEPLACEHOLDERVALUE()const::rc>>
             ::operator()(_result_local,(long)local_30);
    e = pvVar2->f + e;
  }
  tVar3 = std::make_tuple<double&,int&>((double *)r,&i);
  tVar3.super__Tuple_impl<0UL,_double,_int>._0_8_ = r;
  return (tuple<double,_int>)tVar3.super__Tuple_impl<0UL,_double,_int>;
}

Assistant:

std::tuple<double, int>
sum(const R& r, int r_size, int result)
{
    double sumr{ 0 };
    int sumf{ 0 };

    for (int i = 0, e = std::min(r_size - 1, result); i <= e; ++i) {
        sumr += r[i].value;
        sumf += r[i].f;
    }

    return std::make_tuple(sumr, sumf);
}